

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O2

void Saig_ManCexMinVerifyPhase(Aig_Man_t *pAig,Abc_Cex_t *pCex,int f)

{
  undefined1 *puVar1;
  void *pvVar2;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pAVar3;
  int iVar4;
  int iVar5;
  
  puVar1 = &pAig->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 8;
  for (iVar5 = 0; iVar5 < pAig->nTruePis; iVar5 = iVar5 + 1) {
    pvVar2 = Vec_PtrEntry(pAig->vCis,iVar5);
    iVar4 = pCex->nPis * f + pCex->nRegs + iVar5;
    *(ulong *)((long)pvVar2 + 0x18) =
         (*(ulong *)((long)pvVar2 + 0x18) & 0xfffffffffffffff7) +
         (ulong)((uint)(&pCex[1].iPo)[iVar4 >> 5] >> ((byte)iVar4 & 0x1f) & 1) * 8;
  }
  if (f == 0) {
    for (iVar5 = 0; iVar5 < pAig->nRegs; iVar5 = iVar5 + 1) {
      pvVar2 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar5);
      *(byte *)((long)pvVar2 + 0x18) = *(byte *)((long)pvVar2 + 0x18) & 0xf7;
    }
  }
  else {
    for (iVar5 = 0; iVar5 < pAig->nRegs; iVar5 = iVar5 + 1) {
      pObj = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar5);
      pAVar3 = Saig_ObjLoToLi(pAig,pObj);
      *(ulong *)&pObj->field_0x18 =
           *(ulong *)&pObj->field_0x18 & 0xfffffffffffffff7 |
           (ulong)((uint)*(undefined8 *)&pAVar3->field_0x18 & 8);
    }
  }
  for (iVar5 = 0; iVar5 < pAig->vObjs->nSize; iVar5 = iVar5 + 1) {
    pvVar2 = Vec_PtrEntry(pAig->vObjs,iVar5);
    if ((pvVar2 != (void *)0x0) && (0xfffffffd < ((uint)*(ulong *)((long)pvVar2 + 0x18) & 7) - 7)) {
      *(ulong *)((long)pvVar2 + 0x18) =
           (*(ulong *)((long)pvVar2 + 0x18) & 0xfffffffffffffff7) +
           (ulong)((*(uint *)((*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe) + 0x18) >> 3 ^
                   (uint)*(ulong *)((long)pvVar2 + 0x10)) &
                   (*(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x18) >> 3 ^
                   (uint)*(ulong *)((long)pvVar2 + 8)) & 1) * 8;
    }
  }
  for (iVar5 = 0; iVar5 < pAig->vCos->nSize; iVar5 = iVar5 + 1) {
    pvVar2 = Vec_PtrEntry(pAig->vCos,iVar5);
    *(ulong *)((long)pvVar2 + 0x18) =
         *(ulong *)((long)pvVar2 + 0x18) & 0xfffffffffffffff7 |
         (ulong)(((int)*(ulong *)((long)pvVar2 + 8) << 3 ^
                 *(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x18)) & 8);
  }
  return;
}

Assistant:

void Saig_ManCexMinVerifyPhase( Aig_Man_t * pAig, Abc_Cex_t * pCex, int f )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManConst1(pAig)->fPhase = 1;
    Saig_ManForEachPi( pAig, pObj, i )
        pObj->fPhase = Abc_InfoHasBit(pCex->pData, pCex->nRegs + f * pCex->nPis + i);
    if ( f == 0 )
    {
        Saig_ManForEachLo( pAig, pObj, i )
            pObj->fPhase = 0;
    }
    else
    {
        Saig_ManForEachLo( pAig, pObj, i )
            pObj->fPhase = Saig_ObjLoToLi(pAig, pObj)->fPhase;
    }
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->fPhase = (Aig_ObjFaninC0(pObj) ^ Aig_ObjFanin0(pObj)->fPhase) & 
                       (Aig_ObjFaninC1(pObj) ^ Aig_ObjFanin1(pObj)->fPhase);
    Aig_ManForEachCo( pAig, pObj, i )
        pObj->fPhase = (Aig_ObjFaninC0(pObj) ^ Aig_ObjFanin0(pObj)->fPhase);
}